

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

uint8_t * GetBrotliStorage(BrotliEncoderState *s,size_t size)

{
  uint8_t *local_28;
  MemoryManager *m;
  size_t size_local;
  BrotliEncoderState *s_local;
  
  if (s->storage_size_ < size) {
    BrotliFree(&s->memory_manager_,s->storage_);
    s->storage_ = (uint8_t *)0x0;
    if (size == 0) {
      local_28 = (uint8_t *)0x0;
    }
    else {
      local_28 = (uint8_t *)BrotliAllocate(&s->memory_manager_,size);
    }
    s->storage_ = local_28;
    s->storage_size_ = size;
  }
  return s->storage_;
}

Assistant:

static uint8_t* GetBrotliStorage(BrotliEncoderState* s, size_t size) {
  MemoryManager* m = &s->memory_manager_;
  if (s->storage_size_ < size) {
    BROTLI_FREE(m, s->storage_);
    s->storage_ = BROTLI_ALLOC(m, uint8_t, size);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->storage_)) return NULL;
    s->storage_size_ = size;
  }
  return s->storage_;
}